

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O0

void __thiscall HashTable<int>::~HashTable(HashTable<int> *this)

{
  node *pnVar1;
  int local_24;
  int i;
  Node *pp;
  Node *p;
  HashTable<int> *this_local;
  
  for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
    if (this->HashArray[local_24].next != (node *)0x0) {
      pnVar1 = this->HashArray[local_24].next;
      while (pp = pnVar1, pp->next != (node *)0x0) {
        pnVar1 = pp->next;
        if (pp != (Node *)0x0) {
          operator_delete(pp);
        }
      }
    }
  }
  return;
}

Assistant:

~HashTable() {
		Node *p, *pp;
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].next != NULL) {
				p = pp = HashArray[i].next;
				while (p->next != NULL) {
					pp = p;
					p = p->next;
					delete pp;
				}
			}
		}
	}